

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_distFcnElement.cpp
# Opt level: O0

void __thiscall
amrex::SplineDistFcnElement2d::single_spline_cpdist
          (SplineDistFcnElement2d *this,RealVect pt,Real x0,Real x1,Real Dx0,Real Dx1,Real y0,
          Real y1,Real Dy0,Real Dy1,Real *t,RealVect *mincp,Real *mindist)

{
  RealVect pt_00;
  RealVect pt_01;
  Real *pRVar1;
  ostream *poVar2;
  double *in_RCX;
  undefined8 *in_RDX;
  Real *in_RSI;
  SplineDistFcnElement2d *in_RDI;
  Real in_XMM0_Qa;
  Real RVar3;
  double dVar4;
  Real in_XMM1_Qa;
  double dVar5;
  Real in_XMM2_Qa;
  Real in_XMM3_Qa;
  Real in_XMM4_Qa;
  Real in_XMM5_Qa;
  Real in_XMM6_Qa;
  Real in_XMM7_Qa;
  Real in_stack_00000008;
  Real in_stack_00000010;
  RealVect *in_stack_00000018;
  int i;
  Real tnew;
  Real d2yf;
  Real dyf;
  Real d2xf;
  Real dxf;
  int maxIters;
  RealVect deltapt;
  RealVect spt;
  RealVect *in_stack_fffffffffffffea0;
  ostream *in_stack_fffffffffffffeb0;
  RealVect *in_stack_fffffffffffffec8;
  RealVect *in_stack_fffffffffffffed0;
  RealVect *in_stack_ffffffffffffff00;
  Real *in_stack_ffffffffffffff08;
  Real in_stack_ffffffffffffff10;
  Real in_stack_ffffffffffffff18;
  Real in_stack_ffffffffffffff20;
  Real in_stack_ffffffffffffff28;
  RealVect *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  int iVar6;
  double in_stack_ffffffffffffff40;
  double in_stack_ffffffffffffff48;
  SplineDistFcnElement2d *in_stack_ffffffffffffff50;
  double local_a8;
  double in_stack_ffffffffffffff60;
  double dVar7;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 uVar8;
  Real *in_stack_ffffffffffffff70;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  
  *in_RSI = 0.5;
  RealVect::RealVect(in_stack_fffffffffffffea0);
  RealVect::RealVect(in_stack_fffffffffffffea0);
  uVar8 = 1;
  for (iVar6 = 0; iVar6 < 1; iVar6 = iVar6 + 1) {
    pt_00.vect[1]._0_4_ = in_stack_ffffffffffffff68;
    pt_00.vect[0] = in_stack_ffffffffffffff60;
    pt_00.vect[1]._4_4_ = uVar8;
    pt_00.vect[2] = (Real)in_stack_ffffffffffffff70;
    in_stack_ffffffffffffff20 = in_stack_00000008;
    in_stack_ffffffffffffff28 = in_stack_00000010;
    in_stack_ffffffffffffff30 = in_stack_00000018;
    RVar3 = dist(in_stack_ffffffffffffff50,pt_00,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40
                 ,(Real)CONCAT44(iVar6,in_stack_ffffffffffffff38),(Real)in_stack_00000018,
                 in_stack_00000010,in_stack_00000008,in_stack_ffffffffffffff18,
                 in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    *in_RCX = RVar3;
    dxbydt(in_RDI,*in_RSI,in_XMM4_Qa,in_XMM5_Qa,in_XMM6_Qa,in_XMM7_Qa,
           (Real *)&stack0xffffffffffffff50,(Real *)&stack0xffffffffffffff48);
    dxbydt(in_RDI,*in_RSI,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa,in_XMM3_Qa,
           (Real *)&stack0xffffffffffffff60,&local_a8);
    amrex::operator-(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    in_stack_ffffffffffffff40 = *in_RSI;
    in_stack_ffffffffffffff70 = in_stack_ffffffffffffff08;
    pRVar1 = RealVect::operator[]((RealVect *)&stack0xffffffffffffff70,0);
    in_stack_fffffffffffffeb0 = (ostream *)*pRVar1;
    dVar7 = in_stack_ffffffffffffff60;
    pRVar1 = RealVect::operator[]((RealVect *)&stack0xffffffffffffff70,1);
    in_stack_fffffffffffffed0 =
         (RealVect *)
         ((double)in_stack_fffffffffffffeb0 * in_stack_ffffffffffffff60 +
         *pRVar1 * (double)in_stack_ffffffffffffff50);
    dVar5 = (double)in_stack_ffffffffffffff50 * (double)in_stack_ffffffffffffff50;
    dVar4 = dVar7 * dVar7;
    pRVar1 = RealVect::operator[]((RealVect *)&stack0xffffffffffffff70,0);
    in_stack_fffffffffffffec8 = (RealVect *)(*pRVar1 * local_a8 + dVar4 + dVar5);
    pRVar1 = RealVect::operator[]((RealVect *)&stack0xffffffffffffff70,1);
    in_stack_ffffffffffffff40 =
         in_stack_ffffffffffffff40 -
         (double)in_stack_fffffffffffffed0 /
         (*pRVar1 * in_stack_ffffffffffffff48 + (double)in_stack_fffffffffffffec8);
    if (0.0 <= in_stack_ffffffffffffff40) {
      if (1.0 < in_stack_ffffffffffffff40) {
        in_stack_ffffffffffffff40 = 1.0;
      }
    }
    else {
      in_stack_ffffffffffffff40 = 0.0;
    }
    *in_RSI = in_stack_ffffffffffffff40;
    in_stack_ffffffffffffff60 = dVar7;
  }
  pt_01.vect[1]._0_4_ = in_stack_ffffffffffffff68;
  pt_01.vect[0] = in_stack_ffffffffffffff60;
  pt_01.vect[1]._4_4_ = uVar8;
  pt_01.vect[2] = (Real)in_stack_ffffffffffffff70;
  RVar3 = dist(in_stack_ffffffffffffff50,pt_01,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
               (Real)CONCAT44(iVar6,in_stack_ffffffffffffff38),(Real)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_00000018);
  *in_RCX = RVar3;
  *in_RDX = local_78;
  in_RDX[1] = local_70;
  in_RDX[2] = local_68;
  if ((*in_RCX == 0.0) && (!NAN(*in_RCX))) {
    poVar2 = std::operator<<((ostream *)&std::cout,"identified minimum distance of 0.0 at t = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*in_RSI);
    std::operator<<(poVar2,"; cp = ");
    poVar2 = amrex::operator<<(in_stack_fffffffffffffeb0,in_stack_00000018);
    std::operator<<(poVar2," for p = ");
    poVar2 = amrex::operator<<(in_stack_fffffffffffffeb0,in_stack_00000018);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void SplineDistFcnElement2d::single_spline_cpdist(amrex::RealVect pt,
                                    amrex::Real x0, amrex::Real x1,
                                    amrex::Real Dx0, amrex::Real Dx1,
                                    amrex::Real y0, amrex::Real y1,
                                    amrex::Real Dy0, amrex::Real Dy1,
                                    amrex::Real& t, amrex::RealVect& mincp,
                                    amrex::Real& mindist) const {
  t = 0.5;

  amrex::RealVect spt, deltapt;
  const int maxIters = 1;

  amrex::Real dxf, d2xf, dyf, d2yf, tnew;

  for (int i=0; i<maxIters; ++i) {
    mindist = dist(pt, x0, x1, Dx0, Dx1, y0, y1, Dy0, Dy1, t, spt);
    dxbydt(t, y0, y1, Dy0, Dy1, dyf, d2yf);
    dxbydt(t, x0, x1, Dx0, Dx1, dxf, d2xf);

    deltapt =  spt - pt;
    tnew = t - (deltapt[0]*dxf + deltapt[1]*dyf) / (
      dxf*dxf + dyf*dyf + deltapt[0]*d2xf + deltapt[1]*d2yf);

    if (tnew < 0.0) {
      tnew = 0.0;
    } else if (tnew > 1.0) {
      tnew = 1.0;
    }
    t = tnew;
  }
  mindist = dist(pt, x0, x1, Dx0, Dx1, y0, y1, Dy0, Dy1, tnew, spt);
  mincp = spt;

  if (mindist == 0.0) {
    std::cout << "identified minimum distance of 0.0 at t = " << t
              << "; cp = " << mincp << " for p = " << pt << std::endl;
  }
  return;
}